

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Encode(Intercom_Control_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference DTB;
  __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Intercom_Control_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,(this->super_Header).super_Header6.field_0x27);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_CommChannelType).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_SrcEnt);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16SrcCommDevID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8SrcLineID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8TransmitPriority);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8TransmitLineState);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8Command);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_MstrEntID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16MstrCommDeviceID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16MstrChannelID);
  KDataStream::operator<<(pKVar2,this->m_ui32IntrParamLen);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
            ::begin(&this->m_vICP);
  local_28._M_current =
       (IntercomCommunicationParameters *)
       std::
       vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
       ::end(&this->m_vICP);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    DTB = __gnu_cxx::
          __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
          ::operator*(&citrEnd);
    DATA_TYPE::operator<<(stream,&DTB->super_DataTypeBase);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Intercom_Control_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << m_ui8CtrlTyp
           << KDIS_STREAM m_CommChannelType
           << KDIS_STREAM m_SrcEnt
           << m_ui16SrcCommDevID
           << m_ui8SrcLineID
           << m_ui8TransmitPriority
           << m_ui8TransmitLineState
           << m_ui8Command
           << KDIS_STREAM m_MstrEntID
           << m_ui16MstrCommDeviceID
           << m_ui16MstrChannelID
           << m_ui32IntrParamLen;

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << KDIS_STREAM *citr;
    }
}